

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardDemodulation.cpp
# Opt level: O0

BwSimplificationRecord __thiscall
Inferences::BackwardDemodulation::ResultFn::operator()
          (ResultFn *this,
          pair<Kernel::TermList,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
          *arg)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  int iVar4;
  int iVar5;
  ProofExtra PVar6;
  TermList tgtTerm;
  TermList eqLHS;
  Literal *rwLit;
  undefined4 extraout_var;
  Literal **ppLVar7;
  Clause *pCVar8;
  ProofExtra *this_00;
  SubstApplicator *in_RSI;
  long in_RDI;
  Clause *replacement;
  Literal *curr;
  uint i;
  RStack<Literal_*> resLits;
  uint cLen;
  Literal *resLit;
  TermList rhsS;
  TermList lhsS;
  Applicator appl;
  SmartPtr<Indexing::ResultSubstitution> subs;
  TermList rhs;
  TermList lhs;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  TermList in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar9;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 uVar10;
  TermList TVar11;
  TermList what;
  undefined8 in_stack_fffffffffffffd98;
  SubstApplicator *in_stack_fffffffffffffda0;
  InferenceExtra *extra;
  AppliedTerm *in_stack_fffffffffffffda8;
  Clause *unit;
  TermList in_stack_fffffffffffffdb0;
  Inference *in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffe18;
  DemodulationHelper *this_01;
  undefined7 in_stack_fffffffffffffe38;
  SimplifyingInference2 local_188;
  Inference local_170;
  Clause *local_140;
  Literal *local_138;
  uint local_12c;
  uint local_114;
  undefined8 local_110;
  uint64_t local_108;
  Literal *local_100;
  _func_int **local_f8;
  undefined8 local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  void *local_d8;
  undefined8 local_d0;
  void *local_c8;
  DemodulationHelper *local_c0;
  uint64_t uStack_b8;
  InferenceExtra *local_b0;
  uint64_t local_a8;
  AppliedTerm local_a0;
  uint64_t local_88;
  undefined1 local_80 [32];
  _func_int **local_60;
  void *local_58;
  _func_int **local_50;
  undefined4 local_48;
  SmartPtr<Indexing::ResultSubstitution> local_38;
  uint64_t *local_28;
  BwSimplificationRecord local_10;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffd98 >> 0x38);
  Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>::
  QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> *)
           CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
           (QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> *)
           in_stack_fffffffffffffd78._content);
  Kernel::Clause::color((Clause *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  Kernel::Clause::color((Clause *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  bVar1 = Kernel::ColorHelper::compatible(COLOR_TRANSPARENT,0x769597);
  if (!bVar1) {
    BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)0x0);
    local_48 = 1;
    goto LAB_00769dbf;
  }
  if (*(uint64_t *)(in_RDI + 8) != local_28[3]) {
    Lib::SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>::
    operator->((SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_> *)
               (in_RDI + 0x10));
    uVar2 = Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::find
                      ((DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                       (Clause *)in_stack_fffffffffffffd78._content);
    if (!(bool)uVar2) {
      local_60 = in_RSI->_vptr_SubstApplicator;
      local_50 = local_60;
      tgtTerm = Kernel::EqHelper::getOtherEqualitySide
                          ((Literal *)0x7696ab,in_stack_fffffffffffffd78);
      local_58 = (void *)tgtTerm;
      Lib::SmartPtr<Indexing::ResultSubstitution>::SmartPtr
                ((SmartPtr<Indexing::ResultSubstitution> *)(local_80 + 0x10),&local_38);
      eqLHS._content =
           (uint64_t)
           Lib::SmartPtr<Indexing::ResultSubstitution>::ptr
                     ((SmartPtr<Indexing::ResultSubstitution> *)(local_80 + 0x10));
      anon_unknown_6::Applicator::Applicator
                ((Applicator *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (ResultSubstitution *)in_stack_fffffffffffffd78._content);
      local_a8 = *local_28;
      this_01 = *(DemodulationHelper **)(in_RDI + 0x28);
      local_88 = local_a8;
      Kernel::AppliedTerm::AppliedTerm(&local_a0,(TermList)local_a8);
      local_c8 = local_58;
      Kernel::AppliedTerm::AppliedTerm
                (in_stack_fffffffffffffda8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda0,
                 (bool)uVar3);
      pCVar8 = (Clause *)CONCAT44(local_a0.term._content._4_4_,(undefined4)local_a0.term._content);
      iVar4 = (**(code **)(*(long *)this_01 + 0x28))();
      if (iVar4 == 1) {
        rwLit = (Literal *)
                Lib::SmartPtr<Indexing::ResultSubstitution>::operator->
                          ((SmartPtr<Indexing::ResultSubstitution> *)(local_80 + 0x10));
        local_d8 = local_58;
        iVar5 = (*(rwLit->super_Term)._vptr_Term[0x12])(rwLit,local_58);
        local_d0 = CONCAT44(extraout_var,iVar5);
        local_e0 = local_88;
        bVar1 = DemodulationHelper::redundancyCheckNeededForPremise
                          (local_c0,(Clause *)local_a0.applicator,
                           (Literal *)CONCAT44(local_a0._12_4_,local_a0._8_4_),(TermList)uStack_b8);
        uVar9 = local_a0._8_4_;
        uVar10 = local_a0._12_4_;
        TVar11._content = (uint64_t)local_a0.applicator;
        what._content = (uint64_t)local_c0;
        extra = local_b0;
        if (bVar1) {
          local_e8 = local_88;
          local_f0 = local_d0;
          local_f8 = local_50;
          pCVar8 = (Clause *)local_80;
          TVar11._content._7_1_ = uVar2;
          TVar11._content._0_7_ = in_stack_fffffffffffffe38;
          bVar1 = DemodulationHelper::isPremiseRedundant
                            (this_01,(Clause *)CONCAT44(iVar4,in_stack_fffffffffffffe18),rwLit,
                             TVar11,tgtTerm,eqLHS,in_RSI);
          uVar9 = local_a0._8_4_;
          uVar10 = local_a0._12_4_;
          TVar11._content = (uint64_t)local_a0.applicator;
          what._content = (uint64_t)local_c0;
          extra = local_b0;
          if (!bVar1) {
            BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)0x0);
            local_48 = 1;
            uVar9 = local_a0._8_4_;
            uVar10 = local_a0._12_4_;
            goto LAB_00769d87;
          }
        }
        local_108 = local_88;
        local_110 = local_d0;
        local_100 = Kernel::EqHelper::replace((Literal *)CONCAT44(uVar10,uVar9),what,TVar11);
        uVar3 = Kernel::EqHelper::isEqTautology((Literal *)CONCAT44(uVar10,uVar9));
        if ((bool)uVar3) {
          *(int *)(DAT_01333840 + 0x154) = *(int *)(DAT_01333840 + 0x154) + 1;
          Lib::SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>::
          operator->((SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>
                      *)(in_RDI + 0x10));
          Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     CONCAT44(uVar10,uVar9),pCVar8);
          BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)local_28[3]);
          local_48 = 1;
        }
        else {
          local_114 = Kernel::Clause::length((Clause *)local_28[3]);
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                      *)CONCAT44(uVar10,uVar9));
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x769ab8);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)CONCAT44(uVar10,uVar9),(Literal *)pCVar8);
          for (local_12c = 0; local_12c < local_114; local_12c = local_12c + 1) {
            ppLVar7 = Kernel::Clause::operator[]((Clause *)local_28[3],local_12c);
            local_138 = *ppLVar7;
            if (local_138 != (Literal *)local_28[2]) {
              Lib::
              Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
              operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                          *)0x769b38);
              Lib::Stack<Kernel::Literal_*>::push
                        ((Stack<Kernel::Literal_*> *)CONCAT44(uVar10,uVar9),(Literal *)pCVar8);
            }
          }
          *(int *)(DAT_01333840 + 0x150) = *(int *)(DAT_01333840 + 0x150) + 1;
          Lib::SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>::
          operator->((SmartPtr<Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>_>
                      *)(in_RDI + 0x10));
          Lib::DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((DHMultiset<Kernel::Clause_*,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     CONCAT44(uVar10,uVar9),pCVar8);
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)0x769bdc);
          Kernel::SimplifyingInference2::SimplifyingInference2
                    (&local_188,BACKWARD_DEMODULATION,(Clause *)local_28[3],*(Clause **)(in_RDI + 8)
                    );
          Kernel::Inference::Inference
                    ((Inference *)CONCAT44(uVar10,uVar9),(SimplifyingInference2 *)pCVar8);
          pCVar8 = Kernel::Clause::fromStack
                             ((Stack<Kernel::Literal_*> *)CONCAT17(uVar3,in_stack_fffffffffffffdf0),
                              in_stack_fffffffffffffde8);
          Kernel::Inference::~Inference(&local_170);
          local_140 = pCVar8;
          PVar6 = Shell::Options::proofExtra(Lib::env);
          if (PVar6 == FULL) {
            unit = local_140;
            this_00 = (ProofExtra *)::operator_new(0x18);
            RewriteInferenceExtra::RewriteInferenceExtra
                      ((RewriteInferenceExtra *)CONCAT44(uVar10,uVar9),what,TVar11);
            Lib::ProofExtra::insert(this_00,&unit->super_Unit,extra);
          }
          BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)local_28[3],local_140);
          local_48 = 1;
          Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
          ::~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                       *)pCVar8);
        }
      }
      else {
        BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)0x0);
        local_48 = 1;
        uVar9 = local_a0._8_4_;
        uVar10 = local_a0._12_4_;
      }
LAB_00769d87:
      anon_unknown_6::Applicator::~Applicator((Applicator *)0x769d94);
      Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr
                ((SmartPtr<Indexing::ResultSubstitution> *)CONCAT44(uVar10,uVar9));
      goto LAB_00769dbf;
    }
  }
  BwSimplificationRecord::BwSimplificationRecord(&local_10,(Clause *)0x0);
  local_48 = 1;
LAB_00769dbf:
  Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>::
  ~QueryRes((QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> *)
            0x769dcc);
  return local_10;
}

Assistant:

BwSimplificationRecord operator() (pair<TermList,QueryRes<ResultSubstitutionSP, TermLiteralClause>> arg)
  {
    auto qr=arg.second;

    if( !ColorHelper::compatible(_cl->color(), qr.data->clause->color()) ) {
      //colors of premises don't match
      return BwSimplificationRecord(0);
    }

    if(_cl==qr.data->clause || _removed->find(qr.data->clause)) {
      //the retreived clause was already replaced during this
      //backward demodulation
      return BwSimplificationRecord(0);
    }

    TermList lhs=arg.first;
    TermList rhs=EqHelper::getOtherEqualitySide(_eqLit, lhs);

    // AYB there used to be a check here to ensure that the sorts
    // matched. This is no longer necessary, as sort matching / unification
    // is handled directly within the tree

    auto subs = qr.unifier;
    ASS(subs->isIdentityOnResultWhenQueryBound());

    Applicator appl(subs.ptr());

    TermList lhsS=qr.data->term;

    if (_ordering.compareUnidirectional(AppliedTerm(lhsS), AppliedTerm(rhs,&appl,true))!=Ordering::GREATER) {
      return BwSimplificationRecord(0);
    }

    TermList rhsS=subs->applyToBoundQuery(rhs);

    if (_helper.redundancyCheckNeededForPremise(qr.data->clause,qr.data->literal,lhsS) &&
      !_helper.isPremiseRedundant(qr.data->clause,qr.data->literal,lhsS,rhsS,lhs,&appl))
    {
      return BwSimplificationRecord(0);
    }

    Literal* resLit=EqHelper::replace(qr.data->literal,lhsS,rhsS);
    if(EqHelper::isEqTautology(resLit)) {
      env.statistics->backwardDemodulationsToEqTaut++;
      _removed->insert(qr.data->clause);
      return BwSimplificationRecord(qr.data->clause);
    }

    unsigned cLen=qr.data->clause->length();
    RStack<Literal*> resLits;

    resLits->push(resLit);

    for(unsigned i=0;i<cLen;i++) {
      Literal* curr=(*qr.data->clause)[i];
      if(curr!=qr.data->literal) {
        resLits->push(curr);
      }
    }

    env.statistics->backwardDemodulations++;
    _removed->insert(qr.data->clause);
    Clause *replacement = Clause::fromStack(
      *resLits,
      SimplifyingInference2(InferenceRule::BACKWARD_DEMODULATION, qr.data->clause, _cl)
    );
    if(env.options->proofExtra() == Options::ProofExtra::FULL)
      env.proofExtra.insert(replacement, new BackwardDemodulationExtra(lhs, lhsS));
    return BwSimplificationRecord(qr.data->clause, replacement);
  }